

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

int __thiscall CServer::Run(CServer *this)

{
  CNetServer *this_00;
  CConfig *pCVar1;
  IKernel *pIVar2;
  IConsole *pConsole;
  _func_int **pp_Var3;
  NETADDR_conflict BindAddr;
  bool bVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  int64 iVar7;
  int64 iVar8;
  int64 iVar9;
  CInput *pCVar10;
  int c_1;
  long lVar11;
  long lVar12;
  int *piVar13;
  byte bVar14;
  int c;
  ulong uVar15;
  CClient *this_01;
  long in_FS_OFFSET;
  bool aSpecs [64];
  char aBuf [256];
  undefined4 uStack_64;
  undefined4 uStack_60;
  NETADDR local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x17])
                    (this->m_pConsole,(ulong)(uint)this->m_pConfig->m_ConsoleOutputLevel,
                     SendRconLineAuthed,this);
  this->m_PrintCBIndex = iVar5;
  InitMapList(this);
  iVar5 = LoadMap(this,this->m_pConfig->m_SvMap);
  pCVar1 = this->m_pConfig;
  if (iVar5 == 0) {
    dbg_msg("server","failed to load map. mapname=\'%s\'",pCVar1->m_SvMap);
  }
  else {
    this->m_MapChunksPerRequest = pCVar1->m_SvMapDownloadSpeed;
    if (pCVar1->m_Bindaddr[0] == '\0') {
LAB_0010e34d:
      mem_zero(&local_50,0x18);
    }
    else {
      iVar5 = net_host_lookup(pCVar1->m_Bindaddr,&local_50,3);
      if (iVar5 != 0) goto LAB_0010e34d;
    }
    local_50.type = 3;
    pCVar1 = this->m_pConfig;
    local_50.port = (unsigned_short)pCVar1->m_SvPort;
    this_00 = &this->m_NetServer;
    uStack_64 = local_50.ip._0_4_;
    uStack_60 = local_50.ip._4_4_;
    BindAddr.port = local_50.port;
    BindAddr.ip[0xc] = local_50.ip[0xc];
    BindAddr.ip[0xd] = local_50.ip[0xd];
    BindAddr.ip[0xe] = local_50.ip[0xe];
    BindAddr.ip[0xf] = local_50.ip[0xf];
    BindAddr.reserved = local_50.reserved;
    pIVar2 = (this->super_IServer).super_IInterface.m_pKernel;
    pConsole = this->m_pConsole;
    iVar5 = (*pIVar2->_vptr_IKernel[2])(pIVar2,"engine");
    BindAddr.ip[0] = (undefined1)uStack_64;
    BindAddr.ip[1] = uStack_64._1_1_;
    BindAddr.ip[2] = uStack_64._2_1_;
    BindAddr.ip[3] = uStack_64._3_1_;
    BindAddr.type = 3;
    BindAddr.ip[8] = local_50.ip[8];
    BindAddr.ip[9] = local_50.ip[9];
    BindAddr.ip[10] = local_50.ip[10];
    BindAddr.ip[0xb] = local_50.ip[0xb];
    BindAddr.ip[4] = (undefined1)uStack_60;
    BindAddr.ip[5] = uStack_60._1_1_;
    BindAddr.ip[6] = uStack_60._2_1_;
    BindAddr.ip[7] = uStack_60._3_1_;
    bVar4 = CNetServer::Open(this_00,BindAddr,pCVar1,pConsole,
                             (IEngine *)CONCAT44(extraout_var,iVar5),
                             &(this->m_ServerBan).super_CNetBan,this->m_pConfig->m_SvMaxClients,
                             this->m_pConfig->m_SvMaxClientsPerIP,NewClientCallback,
                             DelClientCallback,this);
    if (bVar4) {
      CEcon::Init(&this->m_Econ,this->m_pConfig,this->m_pConsole,&(this->m_ServerBan).super_CNetBan)
      ;
      str_format(aBuf,0x100,"server name is \'%s\'",this->m_pConfig->m_SvName);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",aBuf,0);
      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[2])();
      iVar5 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x15])();
      str_format(aBuf,0x100,"netversion %s",CONCAT44(extraout_var_00,iVar5));
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",aBuf,0);
      iVar5 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x16])();
      iVar6 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x17])();
      iVar5 = str_comp((char *)CONCAT44(extraout_var_01,iVar5),
                       (char *)CONCAT44(extraout_var_02,iVar6));
      if (iVar5 != 0) {
        (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                  (this->m_pConsole,0,"server","WARNING: netversion hash differs",0);
      }
      iVar5 = (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0x14])();
      str_format(aBuf,0x100,"game version %s",CONCAT44(extraout_var_03,iVar5));
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server",aBuf,0);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x10])(this->m_pConsole,0);
      if (this->m_GeneratedRconPassword != 0) {
        dbg_msg("server","+-------------------------+");
        dbg_msg("server","| rcon password: \'%s\' |",this->m_pConfig->m_SvRconPassword);
        dbg_msg("server","+-------------------------+");
      }
      iVar7 = time_get();
      this->m_GameStartTime = iVar7;
      do {
        if (this->m_RunServer != true) goto LAB_0010e914;
        if ((this->m_MapReload != false) || (0x6ffffffe < (this->super_IServer).m_CurrentGameTick))
        {
          this->m_MapReload = false;
          iVar5 = LoadMap(this,this->m_pConfig->m_SvMap);
          if (iVar5 == 0) {
            str_format(aBuf,0x100,"failed to load map. mapname=\'%s\'",this->m_pConfig->m_SvMap);
            (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                      (this->m_pConsole,0,"server",aBuf,0);
            str_copy(this->m_pConfig->m_SvMap,this->m_aCurrentMap,0x80);
          }
          else {
            uVar15 = 0;
            while( true ) {
              pp_Var3 = (this->m_pGameServer->super_IInterface)._vptr_IInterface;
              if (uVar15 == 0x40) break;
              iVar5 = (*pp_Var3[0x12])(this->m_pGameServer,uVar15 & 0xffffffff);
              aSpecs[uVar15] = SUB41(iVar5,0);
              uVar15 = uVar15 + 1;
            }
            (*pp_Var3[4])();
            this_01 = this->m_aClients;
            for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 1) {
              if (1 < this_01->m_State) {
                SendMap(this,(int)lVar11);
                CClient::Reset(this_01);
                this_01->m_State = aSpecs[lVar11] | 2;
              }
              this_01 = this_01 + 1;
            }
            iVar7 = time_get();
            this->m_GameStartTime = iVar7;
            (this->super_IServer).m_CurrentGameTick = 0;
            pIVar2 = (this->super_IServer).super_IInterface.m_pKernel;
            (*pIVar2->_vptr_IKernel[1])(pIVar2,"gameserver",this->m_pGameServer);
            (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[2])();
          }
        }
        bVar4 = false;
        iVar7 = time_get();
        bVar14 = 0;
        while( true ) {
          iVar8 = TickStartTime(this,(this->super_IServer).m_CurrentGameTick + 1);
          if (iVar7 <= iVar8) break;
          iVar5 = (this->super_IServer).m_CurrentGameTick;
          (this->super_IServer).m_CurrentGameTick = iVar5 + 1;
          pCVar10 = &this->m_aClients[0].m_LatestInput;
          piVar13 = &this->m_aClients[0].m_aInputs[0].m_GameTick;
          for (uVar15 = 0; uVar15 != 0x40; uVar15 = uVar15 + 1) {
            iVar6 = this->m_aClients[uVar15].m_State;
            if (iVar6 != 0) {
              lVar11 = 0;
              do {
                lVar12 = lVar11;
                if (lVar12 + 0x204 == 0x19524) goto LAB_0010e80c;
                lVar11 = lVar12 + 0x204;
              } while (*(int *)((long)piVar13 + lVar12) != (this->super_IServer).m_CurrentGameTick);
              if (iVar6 == 5) {
                (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[0xe])
                          (this->m_pGameServer,uVar15 & 0xffffffff,(long)pCVar10[1].m_aData + lVar12
                          );
              }
            }
LAB_0010e80c:
            pCVar10 = (CInput *)((long)(pCVar10 + 0xc9) + 0xcc);
            piVar13 = piVar13 + 0x657c;
          }
          bVar14 = (byte)iVar5 | bVar14;
          (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[5])();
          bVar4 = true;
        }
        if (bVar4) {
          if (this->m_pConfig->m_SvHighBandwidth != 0 || (bVar14 & 1) != 0) {
            DoSnapshot(this);
          }
          UpdateClientRconCommands(this);
          UpdateClientMapListEntries(this);
        }
        CRegister::RegisterUpdate
                  (&this->m_Register,(this->m_NetServer).super_CNetBase.m_Socket.type);
        PumpNetwork(this);
        iVar7 = TickStartTime(this,(this->super_IServer).m_CurrentGameTick + 1);
        iVar8 = time_get();
        iVar9 = time_freq();
        iVar5 = (int)(((iVar7 - iVar8) * 1000) / iVar9);
        if (9 < iVar5) {
          iVar5 = 10;
        }
        if (iVar5 < 2) {
          iVar5 = 1;
        }
        CNetBase::Wait(&this_00->super_CNetBase,iVar5);
      } while (InterruptSignaled == 0);
      (*(this->m_pConsole->super_IInterface)._vptr_IInterface[0x19])
                (this->m_pConsole,0,"server","interrupted",0);
LAB_0010e914:
      CNetServer::Close(this_00,this->m_aShutdownReason);
      CEcon::Shutdown(&this->m_Econ);
      (*(this->m_pGameServer->super_IInterface)._vptr_IInterface[4])();
      Free(this);
      iVar5 = 0;
      goto LAB_0010e993;
    }
    dbg_msg("server","couldn\'t open socket. port %d might already be in use",
            (ulong)(uint)this->m_pConfig->m_SvPort);
  }
  Free(this);
  iVar5 = -1;
LAB_0010e993:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar5;
  }
  __stack_chk_fail();
}

Assistant:

int CServer::Run()
{
	//
	m_PrintCBIndex = Console()->RegisterPrintCallback(Config()->m_ConsoleOutputLevel, SendRconLineAuthed, this);

	InitMapList();

	// load map
	if(!LoadMap(Config()->m_SvMap))
	{
		dbg_msg("server", "failed to load map. mapname='%s'", Config()->m_SvMap);
		Free();
		return -1;
	}
	m_MapChunksPerRequest = Config()->m_SvMapDownloadSpeed;

	// start server
	NETADDR BindAddr;
	if(Config()->m_Bindaddr[0] && net_host_lookup(Config()->m_Bindaddr, &BindAddr, NETTYPE_ALL) == 0)
	{
		// sweet!
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}
	else
	{
		mem_zero(&BindAddr, sizeof(BindAddr));
		BindAddr.type = NETTYPE_ALL;
		BindAddr.port = Config()->m_SvPort;
	}

	if(!m_NetServer.Open(BindAddr, Config(), Console(), Kernel()->RequestInterface<IEngine>(), &m_ServerBan,
		Config()->m_SvMaxClients, Config()->m_SvMaxClientsPerIP, NewClientCallback, DelClientCallback, this))
	{
		dbg_msg("server", "couldn't open socket. port %d might already be in use", Config()->m_SvPort);
		Free();
		return -1;
	}

	m_Econ.Init(Config(), Console(), &m_ServerBan);

	char aBuf[256];
	str_format(aBuf, sizeof(aBuf), "server name is '%s'", Config()->m_SvName);
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	GameServer()->OnInit();
	str_format(aBuf, sizeof(aBuf), "netversion %s", GameServer()->NetVersion());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
	if(str_comp(GameServer()->NetVersionHashUsed(), GameServer()->NetVersionHashReal()))
	{
		m_pConsole->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "WARNING: netversion hash differs");
	}
	str_format(aBuf, sizeof(aBuf), "game version %s", GameServer()->Version());
	Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);

	// process pending commands
	m_pConsole->StoreCommands(false);

	if(m_GeneratedRconPassword)
	{
		dbg_msg("server", "+-------------------------+");
		dbg_msg("server", "| rcon password: '%s' |", Config()->m_SvRconPassword);
		dbg_msg("server", "+-------------------------+");
	}

	// start game
	{
		m_GameStartTime = time_get();

		while(m_RunServer)
		{
			// load new map
			if(m_MapReload || m_CurrentGameTick >= 0x6FFFFFFF) //	force reload to make sure the ticks stay within a valid range
			{
				m_MapReload = false;

				// load map
				if(LoadMap(Config()->m_SvMap))
				{
					// new map loaded
					bool aSpecs[MAX_CLIENTS];
					for(int c = 0; c < MAX_CLIENTS; c++)
						aSpecs[c] = GameServer()->IsClientSpectator(c);

					GameServer()->OnShutdown();

					for(int c = 0; c < MAX_CLIENTS; c++)
					{
						if(m_aClients[c].m_State <= CClient::STATE_AUTH)
							continue;

						SendMap(c);
						m_aClients[c].Reset();
						m_aClients[c].m_State = aSpecs[c] ? CClient::STATE_CONNECTING_AS_SPEC : CClient::STATE_CONNECTING;
					}

					m_GameStartTime = time_get();
					m_CurrentGameTick = 0;
					Kernel()->ReregisterInterface(GameServer());
					GameServer()->OnInit();
				}
				else
				{
					str_format(aBuf, sizeof(aBuf), "failed to load map. mapname='%s'", Config()->m_SvMap);
					Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", aBuf);
					str_copy(Config()->m_SvMap, m_aCurrentMap, sizeof(Config()->m_SvMap));
				}
			}

			int64 Now = time_get();
			bool NewTicks = false;
			bool ShouldSnap = false;
			while(Now > TickStartTime(m_CurrentGameTick+1))
			{
				m_CurrentGameTick++;
				NewTicks = true;
				if((m_CurrentGameTick%2) == 0)
					ShouldSnap = true;

				// apply new input
				for(int c = 0; c < MAX_CLIENTS; c++)
				{
					if(m_aClients[c].m_State == CClient::STATE_EMPTY)
						continue;
					for(int i = 0; i < 200; i++)
					{
						if(m_aClients[c].m_aInputs[i].m_GameTick == Tick())
						{
							if(m_aClients[c].m_State == CClient::STATE_INGAME)
								GameServer()->OnClientPredictedInput(c, m_aClients[c].m_aInputs[i].m_aData);
							break;
						}
					}
				}

				GameServer()->OnTick();
			}

			// snap game
			if(NewTicks)
			{
				if(Config()->m_SvHighBandwidth || ShouldSnap)
					DoSnapshot();

				UpdateClientRconCommands();
				UpdateClientMapListEntries();
			}

			// master server stuff
			m_Register.RegisterUpdate(m_NetServer.NetType());

			PumpNetwork();

			// wait for incoming data
			m_NetServer.Wait(clamp(int((TickStartTime(m_CurrentGameTick+1)-time_get())*1000/time_freq()), 1, 1000/SERVER_TICK_SPEED/2));

			if(InterruptSignaled)
			{
				Console()->Print(IConsole::OUTPUT_LEVEL_STANDARD, "server", "interrupted");
				break;
			}
		}
	}
	// disconnect all clients on shutdown
	m_NetServer.Close(m_aShutdownReason);
	m_Econ.Shutdown();

	GameServer()->OnShutdown();
	Free();

	return 0;
}